

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall JsrtDebugManager::CallDebugEventCallback::AutoClear::~AutoClear(AutoClear *this)

{
  JsrtDebuggerObjectsManager *this_00;
  ArenaAllocator *allocator;
  ThreadContext *this_01;
  DebugManager *this_02;
  AutoClear *this_local;
  
  if (this->jsrtDebugManager->debuggerObjectsManager != (JsrtDebuggerObjectsManager *)0x0) {
    this_00 = GetDebuggerObjectsManager(this->jsrtDebugManager);
    JsrtDebuggerObjectsManager::ClearAll(this_00);
  }
  if (this->jsrtDebugManager->stackFrames != (JsrtDebugStackFrames *)0x0) {
    allocator = GetDebugObjectArena(this->jsrtDebugManager);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebugStackFrames>
              (allocator,this->jsrtDebugManager->stackFrames);
    this->jsrtDebugManager->stackFrames = (JsrtDebugStackFrames *)0x0;
  }
  this_01 = GetThreadContext(this->jsrtDebugManager);
  this_02 = ThreadContext::GetDebugManager(this_01);
  Js::DebugManager::SetDispatchHaltFrameAddress(this_02,(void *)0x0);
  this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  return;
}

Assistant:

~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }